

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  
  for (lVar1 = -0x420; lVar1 != 0; lVar1 = lVar1 + 0x30) {
    *(undefined4 *)((long)this->trans[0][0] + lVar1 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->trans[0][0] + lVar1) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar1 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar1) = 0xfffffffe;
  }
  for (lVar1 = -0x30; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->trans[0][0] + lVar1) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][1] + lVar1) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar1) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[0][1] + lVar1) = 0xfffffffe;
  }
  return -2;
}

Assistant:

void GameBoard::init()
{
    int i;
    for (i = 0; i < MAPHEIGHT + 2; i++) {
        gridInfo[1][i][0] = gridInfo[1][i][MAPWIDTH + 1] = -2;
        gridInfo[0][i][0] = gridInfo[0][i][MAPWIDTH + 1] = -2;
    }
    for (i = 0; i < MAPWIDTH + 2; i++) {
        gridInfo[1][0][i] = gridInfo[1][MAPHEIGHT + 1][i] = -2;
        gridInfo[0][0][i] = gridInfo[0][MAPHEIGHT + 1][i] = -2;
    }
}